

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorsTests.cpp
# Opt level: O2

void __thiscall
VectorsTest_Int3Greater_Test::VectorsTest_Int3Greater_Test(VectorsTest_Int3Greater_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_001f50a8;
  return;
}

Assistant:

TEST(VectorsTest, Int3Greater)
{
    Int3 v1(13, 25, 21), v2(6, 8, 2), v3(14, 6, 1);
    ASSERT_TRUE(v1 > v2);
    ASSERT_FALSE(v2 > v1);
    ASSERT_FALSE(v1 > v3);
    ASSERT_FALSE(v3 > v1);
    ASSERT_FALSE(v2 > v3);
    ASSERT_FALSE(v3 > v2);
}